

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O2

void __thiscall
vkt::pipeline::CoordinateCaptureProgram::CoordinateCaptureProgram(CoordinateCaptureProgram *this)

{
  (this->super_Program)._vptr_Program = (_func_int **)&PTR__CoordinateCaptureProgram_00bfd288;
  TexCoordVertexShader::TexCoordVertexShader(&this->m_vertexShader);
  CoordinateCaptureFragmentShader::CoordinateCaptureFragmentShader(&this->m_fragmentShader);
  return;
}

Assistant:

CoordinateCaptureProgram (void)
	{
	}